

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error-formatter.cc
# Opt level: O1

void wabt::FormatErrorsToFile
               (Errors *errors,Type location_type,LexerSourceLineFinder *line_finder,FILE *file,
               string *header,PrintHeader print_header,int source_line_max_length)

{
  Color color;
  string s;
  
  Color::Color(&color,file,true);
  FormatErrorsToString
            (&s,errors,location_type,line_finder,&color,header,print_header,source_line_max_length);
  fwrite(s._M_dataplus._M_p,1,s._M_string_length,(FILE *)file);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)s._M_dataplus._M_p != &s.field_2) {
    operator_delete(s._M_dataplus._M_p,s.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void FormatErrorsToFile(const Errors& errors,
                        Location::Type location_type,
                        LexerSourceLineFinder* line_finder,
                        FILE* file,
                        const std::string& header,
                        PrintHeader print_header,
                        int source_line_max_length) {
  Color color(file);
  std::string s =
      FormatErrorsToString(errors, location_type, line_finder, color, header,
                           print_header, source_line_max_length);
  fwrite(s.data(), 1, s.size(), file);
}